

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::PipelineCreateInfo::ViewportState::ViewportState
          (ViewportState *this,ViewportState *other)

{
  uint uVar1;
  VkViewport *__first;
  pointer pVVar2;
  pointer pVVar3;
  VkRect2D *__first_00;
  pointer pVVar4;
  pointer pVVar5;
  allocator_type local_39;
  pointer local_38;
  pointer pVStack_30;
  pointer local_28;
  
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_VkPipelineViewportStateCreateInfo).sType =
       (other->super_VkPipelineViewportStateCreateInfo).sType;
  (this->super_VkPipelineViewportStateCreateInfo).pNext =
       (other->super_VkPipelineViewportStateCreateInfo).pNext;
  (this->super_VkPipelineViewportStateCreateInfo).flags =
       (other->super_VkPipelineViewportStateCreateInfo).flags;
  uVar1 = (other->super_VkPipelineViewportStateCreateInfo).viewportCount;
  (this->super_VkPipelineViewportStateCreateInfo).viewportCount = uVar1;
  (this->super_VkPipelineViewportStateCreateInfo).scissorCount =
       (other->super_VkPipelineViewportStateCreateInfo).scissorCount;
  __first = (other->super_VkPipelineViewportStateCreateInfo).pViewports;
  std::vector<vk::VkViewport,std::allocator<vk::VkViewport>>::vector<vk::VkViewport_const*,void>
            ((vector<vk::VkViewport,std::allocator<vk::VkViewport>> *)&local_38,__first,
             __first + uVar1,&local_39);
  pVVar2 = (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish = pVStack_30;
  (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar2 != (pointer)0x0) {
    operator_delete(pVVar2,(long)pVVar3 - (long)pVVar2);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  __first_00 = (other->super_VkPipelineViewportStateCreateInfo).pScissors;
  std::vector<vk::VkRect2D,std::allocator<vk::VkRect2D>>::vector<vk::VkRect2D_const*,void>
            ((vector<vk::VkRect2D,std::allocator<vk::VkRect2D>> *)&local_38,__first_00,
             __first_00 + (this->super_VkPipelineViewportStateCreateInfo).scissorCount,
             (allocator_type *)&local_39);
  pVVar4 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar5 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_38;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pVStack_30;
  (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_28;
  local_38 = (pointer)0x0;
  pVStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)pVVar5 - (long)pVVar4);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38,(long)local_28 - (long)local_38);
    }
  }
  pVVar4 = (this->m_scissors).super__Vector_base<vk::VkRect2D,_std::allocator<vk::VkRect2D>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pViewports =
       (this->m_viewports).super__Vector_base<vk::VkViewport,_std::allocator<vk::VkViewport>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->super_VkPipelineViewportStateCreateInfo).pScissors = pVVar4;
  return;
}

Assistant:

PipelineCreateInfo::ViewportState::ViewportState (const ViewportState& other)
{
	sType			= other.sType;
	pNext			= other.pNext;
	flags			= other.flags;
	viewportCount	= other.viewportCount;
	scissorCount	= other.scissorCount;

	m_viewports = std::vector<vk::VkViewport>(other.pViewports, other.pViewports + viewportCount);
	m_scissors	= std::vector<vk::VkRect2D>(other.pScissors, other.pScissors + scissorCount);

	pViewports	= &m_viewports[0];
	pScissors	= &m_scissors[0];
}